

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O2

blob_t blobCreate(size_t size)

{
  size_t *psVar1;
  
  if ((size != 0) &&
     (psVar1 = (size_t *)memAlloc(size + 0x407 & 0xfffffffffffffc00), psVar1 != (size_t *)0x0)) {
    *psVar1 = size;
    memSet(psVar1 + 1,'\0',size);
    return psVar1 + 1;
  }
  return (blob_t)0x0;
}

Assistant:

blob_t blobCreate(size_t size)
{
	size_t* ptr;
	if (size == 0)
		return 0;
	ptr = (size_t*)memAlloc(blobActualSize(size));
	if (ptr == 0)
		return 0;
	*ptr = size;
	memSetZero(blobValueOf(ptr), size);
	return blobValueOf(ptr);
}